

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O2

slReturn ubxGetVersion(int fdPort,int verbosity,ubxVersion *version)

{
  ubxMsg pollMsg;
  _Bool _Var1;
  int iVar2;
  slBuffer *body;
  slReturn pvVar3;
  byte *source;
  char *pcVar4;
  size_t sVar5;
  char ***pppcVar6;
  char **ppcVar7;
  int i;
  long lVar8;
  ubxMsg versionMsg;
  ubxMsg msg;
  
  body = create_slBuffer(0,LittleEndian);
  createUbxMsg(&msg,(ubxType)0x40a,body);
  pollMsg.body = msg.body;
  pollMsg.type = msg.type;
  pollMsg._2_6_ = msg._2_6_;
  pollMsg.checksum = msg.checksum;
  pollMsg._18_6_ = msg._18_6_;
  pvVar3 = pollUbx(fdPort,pollMsg,2000,&versionMsg);
  _Var1 = isErrorReturn(pvVar3);
  if (_Var1) {
    return pvVar3;
  }
  source = buffer_slBuffer(versionMsg.body);
  pcVar4 = getAllocatedStringCopy((char *)source);
  version->software = pcVar4;
  pcVar4 = getAllocatedStringCopy((char *)(source + 0x1e));
  version->hardware = pcVar4;
  sVar5 = size_slBuffer(versionMsg.body);
  iVar2 = ((int)sVar5 + -0x28) / 0x1e;
  version->number_of_extensions = iVar2;
  if ((int)sVar5 - 0xbU < 0x3b) {
    pppcVar6 = &version->extensions;
  }
  else {
    pppcVar6 = (char ***)safeMalloc((long)iVar2 << 3);
    version->extensions = (char **)pppcVar6;
    lVar8 = 0x28;
    while( true ) {
      sVar5 = size_slBuffer(versionMsg.body);
      if ((int)sVar5 <= lVar8) break;
      ppcVar7 = (char **)getAllocatedStringCopy((char *)(source + lVar8));
      *pppcVar6 = ppcVar7;
      pppcVar6 = pppcVar6 + 1;
      lVar8 = lVar8 + 0x1e;
    }
  }
  *pppcVar6 = (char **)0x0;
  pvVar3 = makeOkReturn();
  return pvVar3;
}

Assistant:

extern slReturn ubxGetVersion(int fdPort, int verbosity, ubxVersion* version) {

    ubxType type = { UBX_MON, UBX_MON_VER };
    slBuffer* body = create_slBuffer(0, LittleEndian);
    ubxMsg msg = createUbxMsg(type, body);
    ubxMsg versionMsg;
    slReturn result = pollUbx(fdPort, msg, MON_VER_MAX_MS, &versionMsg);
    if (isErrorReturn(result)) return result;

    // decode the message and print the results...
    char* buf = (char *) buffer_slBuffer(versionMsg.body);

    version->software = getAllocatedStringCopy(buf);
    version->hardware = getAllocatedStringCopy(buf + 30);

    // calculate the number of extension entries we have...
    int ne = ((int) size_slBuffer(versionMsg.body) - 40) / 30;
    version->number_of_extensions = ne;
    if (ne == 0)
        version->extensions = NULL;
    else {
        version->extensions = safeMalloc((size_t) (sizeof(buf) * ne));
        char** ptr = version->extensions;
        for (int i = 40; i < (int) size_slBuffer(versionMsg.body); i += 30) {
            *ptr = getAllocatedStringCopy(buf + i);
            ptr++;
        }
        *ptr = NULL;
    }

    return makeOkReturn();
}